

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateAppleFrameworkScript
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *evaluatedRPaths,Indent indent)

{
  char **a;
  ostream *poVar1;
  cmScriptGeneratorIndent indent_00;
  string depNameVar;
  string local_78;
  string depName;
  
  poVar1 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar1 = std::operator<<(poVar1,"if(");
  a = &this->TmpVarPrefix;
  poVar1 = std::operator<<(poVar1,this->TmpVarPrefix);
  poVar1 = std::operator<<(poVar1,"_dep MATCHES \"^(.*/)?([^/]*\\\\.framework)/(.*)$\")\n");
  indent_00.Level = indent.Level + 2;
  poVar1 = ::operator<<(poVar1,indent_00);
  poVar1 = std::operator<<(poVar1,"set(");
  poVar1 = std::operator<<(poVar1,this->TmpVarPrefix);
  poVar1 = std::operator<<(poVar1,"_dir \"${CMAKE_MATCH_1}\")\n");
  poVar1 = ::operator<<(poVar1,indent_00);
  poVar1 = std::operator<<(poVar1,"set(");
  poVar1 = std::operator<<(poVar1,this->TmpVarPrefix);
  poVar1 = std::operator<<(poVar1,"_name \"${CMAKE_MATCH_2}\")\n");
  poVar1 = ::operator<<(poVar1,indent_00);
  poVar1 = std::operator<<(poVar1,"set(");
  poVar1 = std::operator<<(poVar1,this->TmpVarPrefix);
  poVar1 = std::operator<<(poVar1,"_file \"${CMAKE_MATCH_3}\")\n");
  poVar1 = ::operator<<(poVar1,indent_00);
  poVar1 = std::operator<<(poVar1,"set(");
  poVar1 = std::operator<<(poVar1,this->TmpVarPrefix);
  poVar1 = std::operator<<(poVar1,"_path \"${");
  poVar1 = std::operator<<(poVar1,this->TmpVarPrefix);
  poVar1 = std::operator<<(poVar1,"_dir}${");
  poVar1 = std::operator<<(poVar1,this->TmpVarPrefix);
  std::operator<<(poVar1,"_name}\")\n");
  cmStrCat<char_const*&,char_const(&)[6]>(&depName,a,(char (*) [6])0x73a262);
  GetDestination(&depNameVar,this,config);
  local_78.field_2._M_allocated_capacity = 0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&depNameVar,cmInstallType_DIRECTORY,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_78,false,(this->Permissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
             " USE_SOURCE_PERMISSIONS",(Indent)indent_00.Level,depName._M_dataplus._M_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  std::__cxx11::string::~string((string *)&depNameVar);
  cmStrCat<char_const(&)[3],char_const*&,char_const(&)[10],char_const*&,char_const(&)[7]>
            (&depNameVar,(char (*) [3])0x76f66f,a,(char (*) [10])"_name}/${",a,
             (char (*) [7])0x7613b8);
  cmStrCat<char_const(&)[3],char_const*&,char_const(&)[6]>
            (&local_78,(char (*) [3])0x76f66f,a,(char (*) [6])"_dep}");
  GenerateInstallNameFixup
            (this,os,config,evaluatedRPaths,&local_78,&depNameVar,(Indent)indent_00.Level);
  std::__cxx11::string::~string((string *)&local_78);
  poVar1 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  std::operator<<(poVar1,"endif()\n");
  std::__cxx11::string::~string((string *)&depNameVar);
  std::__cxx11::string::~string((string *)&depName);
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateAppleFrameworkScript(
  std::ostream& os, const std::string& config,
  const std::vector<std::string>& evaluatedRPaths, Indent indent)
{
  os << indent << "if(" << this->TmpVarPrefix
     << "_dep MATCHES \"^(.*/)?([^/]*\\\\.framework)/(.*)$\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix
     << "_dir \"${CMAKE_MATCH_1}\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix
     << "_name \"${CMAKE_MATCH_2}\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix
     << "_file \"${CMAKE_MATCH_3}\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix << "_path \"${"
     << this->TmpVarPrefix << "_dir}${" << this->TmpVarPrefix << "_name}\")\n";

  auto depName = cmStrCat(this->TmpVarPrefix, "_path");
  this->AddInstallRule(
    os, this->GetDestination(config), cmInstallType_DIRECTORY, {}, false,
    this->Permissions.c_str(), nullptr, nullptr, " USE_SOURCE_PERMISSIONS",
    indent.Next(), depName.c_str());

  auto depNameVar = cmStrCat("${", this->TmpVarPrefix, "_name}/${",
                             this->TmpVarPrefix, "_file}");
  this->GenerateInstallNameFixup(os, config, evaluatedRPaths,
                                 cmStrCat("${", this->TmpVarPrefix, "_dep}"),
                                 depNameVar, indent.Next());

  os << indent << "endif()\n";
}